

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_8_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  long lVar34;
  short sVar35;
  undefined4 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  short sVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ushort uVar59;
  short sVar60;
  short sVar61;
  ushort uVar68;
  ushort uVar72;
  ushort uVar76;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  undefined1 auVar62 [16];
  ushort uVar84;
  undefined1 auVar63 [16];
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  undefined1 auVar64 [16];
  short sVar85;
  short sVar88;
  short sVar89;
  short sVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  __m128i d7;
  longlong local_258;
  longlong lStack_250;
  longlong local_248;
  longlong lStack_240;
  undefined8 local_238;
  longlong lStack_230;
  undefined8 local_228;
  longlong lStack_220;
  undefined8 local_218;
  longlong lStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  longlong lStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  longlong lStack_1c0;
  longlong local_1b8;
  longlong lStack_1b0;
  longlong local_1a8;
  undefined8 uStack_1a0;
  longlong local_198;
  longlong lStack_190;
  longlong local_188;
  longlong lStack_180;
  __m128i p3;
  longlong local_168;
  longlong lStack_160;
  __m128i p1;
  __m128i p2;
  __m128i d5;
  __m128i d4;
  longlong local_118;
  longlong lStack_110;
  longlong local_108;
  longlong lStack_100;
  __m128i abs_p1p0;
  __m128i local_e8;
  __m128i local_d8;
  __m128i hev;
  __m128i mask;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i pq [4];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  
  p3[0] = *(longlong *)(s + -4);
  p3[1] = *(longlong *)s;
  p2[0] = *(longlong *)(s + (long)p + -4);
  p2[1] = *(longlong *)(s + (long)p + -4 + 4);
  p1[0] = *(longlong *)(s + (long)(p * 2) + -4);
  p1[1] = *(longlong *)(s + (long)(p * 2) + -4 + 4);
  lVar34 = (long)(p * 3);
  local_168 = *(longlong *)(s + lVar34 + -4);
  lStack_160 = *(longlong *)(s + lVar34 + -4 + 4);
  highbd_transpose4x8_8x4_sse2
            (&p3,&p2,&p1,(__m128i *)&local_168,(__m128i *)&local_248,(__m128i *)&local_188,
             (__m128i *)&local_108,(__m128i *)&local_118,&d4,&d5,(__m128i *)&local_258,&d7);
  local_1c8 = local_118;
  lStack_1c0 = lStack_110;
  local_1d8 = d4[0];
  uStack_1d0 = d4[1];
  local_198 = local_118;
  lStack_190 = d4[0];
  pq[0][0] = local_118;
  pq[0][1] = d4[0];
  local_1f8 = local_108;
  uStack_1f0 = lStack_100;
  local_208 = d5[0];
  uStack_200 = d5[1];
  pq[1][0] = local_108;
  pq[1][1] = d5[0];
  local_228 = local_188;
  lStack_220 = lStack_180;
  local_1e8 = local_258;
  lStack_1e0 = lStack_250;
  local_1b8 = local_188;
  lStack_1b0 = local_258;
  pq[2][0] = local_188;
  pq[2][1] = local_258;
  local_218 = CONCAT26(d7[0]._6_2_,CONCAT24(d7[0]._4_2_,CONCAT22(d7[0]._2_2_,(undefined2)d7[0])));
  local_238 = local_248;
  lStack_230 = lStack_240;
  lStack_210 = d7[1];
  local_1a8 = local_248;
  pq[3][0] = local_248;
  auVar38 = *(undefined1 (*) [16])blimit;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar38._0_13_;
  auVar4[0xe] = auVar38[7];
  auVar7[0xc] = auVar38[6];
  auVar7._0_12_ = auVar38._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar38._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar38[5];
  auVar13._0_10_ = auVar38._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar38._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar38[4];
  auVar19._0_8_ = auVar38._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar23._7_8_ = 0;
  auVar23._0_7_ = auVar19._8_7_;
  auVar28._1_8_ = SUB158(auVar23 << 0x40,7);
  auVar28[0] = auVar38[3];
  auVar28._9_6_ = 0;
  auVar29._1_10_ = SUB1510(auVar28 << 0x30,5);
  auVar29[0] = auVar38[2];
  auVar29._11_4_ = 0;
  auVar86._3_12_ = SUB1512(auVar29 << 0x20,3);
  auVar86[2] = auVar38[1];
  auVar86[0] = auVar38[0];
  auVar86[1] = 0;
  auVar86[0xf] = 0;
  auVar48 = ZEXT416(bd - 8);
  blimit_1 = (__m128i)psllw(auVar86,auVar48);
  auVar38 = *(undefined1 (*) [16])limit;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar38._0_13_;
  auVar2[0xe] = auVar38[7];
  auVar5[0xc] = auVar38[6];
  auVar5._0_12_ = auVar38._0_12_;
  auVar5._13_2_ = auVar2._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar38._0_11_;
  auVar8._12_3_ = auVar5._12_3_;
  auVar11[10] = auVar38[5];
  auVar11._0_10_ = auVar38._0_10_;
  auVar11._11_4_ = auVar8._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar38._0_9_;
  auVar14._10_5_ = auVar11._10_5_;
  auVar17[8] = auVar38[4];
  auVar17._0_8_ = auVar38._0_8_;
  auVar17._9_6_ = auVar14._9_6_;
  auVar24._7_8_ = 0;
  auVar24._0_7_ = auVar17._8_7_;
  auVar30._1_8_ = SUB158(auVar24 << 0x40,7);
  auVar30[0] = auVar38[3];
  auVar30._9_6_ = 0;
  auVar31._1_10_ = SUB1510(auVar30 << 0x30,5);
  auVar31[0] = auVar38[2];
  auVar31._11_4_ = 0;
  auVar20[2] = auVar38[1];
  auVar20._0_2_ = auVar38._0_2_;
  auVar20._3_12_ = SUB1512(auVar31 << 0x20,3);
  auVar91._0_2_ = auVar38._0_2_ & 0xff;
  auVar91._2_13_ = auVar20._2_13_;
  auVar91[0xf] = 0;
  limit_1 = (__m128i)psllw(auVar91,auVar48);
  auVar38 = *(undefined1 (*) [16])thresh;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar38._0_13_;
  auVar3[0xe] = auVar38[7];
  auVar6[0xc] = auVar38[6];
  auVar6._0_12_ = auVar38._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar38._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar38[5];
  auVar12._0_10_ = auVar38._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar38._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar38[4];
  auVar18._0_8_ = auVar38._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar25._7_8_ = 0;
  auVar25._0_7_ = auVar18._8_7_;
  auVar32._1_8_ = SUB158(auVar25 << 0x40,7);
  auVar32[0] = auVar38[3];
  auVar32._9_6_ = 0;
  auVar33._1_10_ = SUB1510(auVar32 << 0x30,5);
  auVar33[0] = auVar38[2];
  auVar33._11_4_ = 0;
  auVar37._3_12_ = SUB1512(auVar33 << 0x20,3);
  auVar37[2] = auVar38[1];
  auVar37[0] = auVar38[0];
  auVar37[1] = 0;
  auVar37[0xf] = 0;
  thresh_1 = (__m128i)psllw(auVar37,auVar48);
  auVar38 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar38 = pshuflw(auVar38,auVar38,0);
  uVar36 = auVar38._0_4_;
  uStack_1a0 = local_218;
  highbd_hev_filter_mask_x_sse2
            (pq,4,&local_d8,&local_e8,&abs_p1p0,&limit_1,&blimit_1,&thresh_1,&hev,&mask);
  auVar38 = psllw(_DAT_0046e8b0,ZEXT416((uint)bd));
  auVar44._8_4_ = 0xffffffff;
  auVar44._0_8_ = 0xffffffffffffffff;
  auVar44._12_4_ = 0xffffffff;
  auVar52 = paddsw(auVar38,auVar44);
  auVar38._4_4_ = uVar36;
  auVar38._0_4_ = uVar36;
  auVar38._8_4_ = uVar36;
  auVar38._12_4_ = uVar36;
  auVar52 = psubsw(auVar52,auVar38);
  auVar86 = psubsw((undefined1  [16])0x0,auVar38);
  auVar91 = psubsw((undefined1  [16])local_d8,auVar38);
  auVar39 = psubsw((undefined1  [16])local_e8,auVar38);
  auVar62 = psubsw(auVar91,auVar39);
  sVar78 = auVar52._0_2_;
  sVar60 = auVar62._0_2_;
  uVar59 = (ushort)(sVar78 < sVar60) * sVar78 | (ushort)(sVar78 >= sVar60) * sVar60;
  sVar77 = auVar52._2_2_;
  sVar60 = auVar62._2_2_;
  uVar68 = (ushort)(sVar77 < sVar60) * sVar77 | (ushort)(sVar77 >= sVar60) * sVar60;
  sVar79 = auVar52._4_2_;
  sVar60 = auVar62._4_2_;
  uVar72 = (ushort)(sVar79 < sVar60) * sVar79 | (ushort)(sVar79 >= sVar60) * sVar60;
  sVar80 = auVar52._6_2_;
  sVar60 = auVar62._6_2_;
  uVar76 = (ushort)(sVar80 < sVar60) * sVar80 | (ushort)(sVar80 >= sVar60) * sVar60;
  sVar85 = auVar52._8_2_;
  sVar60 = auVar62._8_2_;
  uVar81 = (ushort)(sVar85 < sVar60) * sVar85 | (ushort)(sVar85 >= sVar60) * sVar60;
  sVar88 = auVar52._10_2_;
  sVar60 = auVar62._10_2_;
  uVar82 = (ushort)(sVar88 < sVar60) * sVar88 | (ushort)(sVar88 >= sVar60) * sVar60;
  sVar89 = auVar52._12_2_;
  sVar60 = auVar62._12_2_;
  sVar61 = auVar62._14_2_;
  uVar83 = (ushort)(sVar89 < sVar60) * sVar89 | (ushort)(sVar89 >= sVar60) * sVar60;
  sVar90 = auVar52._14_2_;
  uVar84 = (ushort)(sVar90 < sVar61) * sVar90 | (ushort)(sVar90 >= sVar61) * sVar61;
  sVar60 = auVar86._0_2_;
  auVar63._0_2_ = (ushort)((short)uVar59 < sVar60) * sVar60 | ((short)uVar59 >= sVar60) * uVar59;
  sVar61 = auVar86._2_2_;
  auVar63._2_2_ = (ushort)((short)uVar68 < sVar61) * sVar61 | ((short)uVar68 >= sVar61) * uVar68;
  sVar70 = auVar86._4_2_;
  auVar63._4_2_ = (ushort)((short)uVar72 < sVar70) * sVar70 | ((short)uVar72 >= sVar70) * uVar72;
  sVar69 = auVar86._6_2_;
  auVar63._6_2_ = (ushort)((short)uVar76 < sVar69) * sVar69 | ((short)uVar76 >= sVar69) * uVar76;
  sVar71 = auVar86._8_2_;
  auVar63._8_2_ = (ushort)((short)uVar81 < sVar71) * sVar71 | ((short)uVar81 >= sVar71) * uVar81;
  sVar74 = auVar86._10_2_;
  auVar63._10_2_ = (ushort)((short)uVar82 < sVar74) * sVar74 | ((short)uVar82 >= sVar74) * uVar82;
  sVar73 = auVar86._12_2_;
  auVar63._12_2_ = (ushort)((short)uVar83 < sVar73) * sVar73 | ((short)uVar83 >= sVar73) * uVar83;
  sVar75 = auVar86._14_2_;
  auVar63._14_2_ = (ushort)((short)uVar84 < sVar75) * sVar75 | ((short)uVar84 >= sVar75) * uVar84;
  auVar52 = psubsw(auVar63 >> 0x40 & (undefined1  [16])hev,auVar63);
  auVar52 = psubsw(auVar52,auVar63);
  auVar52 = psubsw(auVar52,auVar63);
  sVar35 = auVar52._0_2_;
  uVar59 = (ushort)(sVar78 < sVar35) * sVar78 | (ushort)(sVar78 >= sVar35) * sVar35;
  sVar35 = auVar52._2_2_;
  uVar68 = (ushort)(sVar77 < sVar35) * sVar77 | (ushort)(sVar77 >= sVar35) * sVar35;
  sVar35 = auVar52._4_2_;
  uVar72 = (ushort)(sVar79 < sVar35) * sVar79 | (ushort)(sVar79 >= sVar35) * sVar35;
  sVar35 = auVar52._6_2_;
  uVar76 = (ushort)(sVar80 < sVar35) * sVar80 | (ushort)(sVar80 >= sVar35) * sVar35;
  sVar35 = auVar52._8_2_;
  uVar81 = (ushort)(sVar85 < sVar35) * sVar85 | (ushort)(sVar85 >= sVar35) * sVar35;
  sVar35 = auVar52._10_2_;
  uVar82 = (ushort)(sVar88 < sVar35) * sVar88 | (ushort)(sVar88 >= sVar35) * sVar35;
  sVar35 = auVar52._12_2_;
  sVar43 = auVar52._14_2_;
  uVar83 = (ushort)(sVar89 < sVar35) * sVar89 | (ushort)(sVar89 >= sVar35) * sVar35;
  uVar84 = (ushort)(sVar90 < sVar43) * sVar90 | (ushort)(sVar90 >= sVar43) * sVar43;
  auVar94._0_2_ = (ushort)((short)uVar59 < sVar60) * sVar60 | ((short)uVar59 >= sVar60) * uVar59;
  auVar94._2_2_ = (ushort)((short)uVar68 < sVar61) * sVar61 | ((short)uVar68 >= sVar61) * uVar68;
  auVar94._4_2_ = (ushort)((short)uVar72 < sVar70) * sVar70 | ((short)uVar72 >= sVar70) * uVar72;
  auVar94._6_2_ = (ushort)((short)uVar76 < sVar69) * sVar69 | ((short)uVar76 >= sVar69) * uVar76;
  auVar94._8_2_ = (ushort)((short)uVar81 < sVar71) * sVar71 | ((short)uVar81 >= sVar71) * uVar81;
  auVar94._10_2_ = (ushort)((short)uVar82 < sVar74) * sVar74 | ((short)uVar82 >= sVar74) * uVar82;
  auVar94._12_2_ = (ushort)((short)uVar83 < sVar73) * sVar73 | ((short)uVar83 >= sVar73) * uVar83;
  auVar94._14_2_ = (ushort)((short)uVar84 < sVar75) * sVar75 | ((short)uVar84 >= sVar75) * uVar84;
  auVar94 = auVar94 & (undefined1  [16])mask;
  auVar95._0_8_ = auVar94._0_8_;
  auVar95._8_4_ = auVar94._0_4_;
  auVar95._12_4_ = auVar94._4_4_;
  auVar52 = paddsw(auVar95,_DAT_0046e8c0);
  sVar35 = auVar52._0_2_;
  uVar59 = (ushort)(sVar78 < sVar35) * sVar78 | (ushort)(sVar78 >= sVar35) * sVar35;
  sVar35 = auVar52._2_2_;
  uVar68 = (ushort)(sVar77 < sVar35) * sVar77 | (ushort)(sVar77 >= sVar35) * sVar35;
  sVar35 = auVar52._4_2_;
  uVar72 = (ushort)(sVar79 < sVar35) * sVar79 | (ushort)(sVar79 >= sVar35) * sVar35;
  sVar35 = auVar52._6_2_;
  uVar76 = (ushort)(sVar80 < sVar35) * sVar80 | (ushort)(sVar80 >= sVar35) * sVar35;
  sVar35 = auVar52._8_2_;
  uVar81 = (ushort)(sVar85 < sVar35) * sVar85 | (ushort)(sVar85 >= sVar35) * sVar35;
  sVar35 = auVar52._10_2_;
  uVar82 = (ushort)(sVar88 < sVar35) * sVar88 | (ushort)(sVar88 >= sVar35) * sVar35;
  sVar35 = auVar52._12_2_;
  sVar43 = auVar52._14_2_;
  uVar83 = (ushort)(sVar89 < sVar35) * sVar89 | (ushort)(sVar89 >= sVar35) * sVar35;
  uVar84 = (ushort)(sVar90 < sVar43) * sVar90 | (ushort)(sVar90 >= sVar43) * sVar43;
  auVar96._0_2_ = (ushort)((short)uVar59 < sVar60) * sVar60 | ((short)uVar59 >= sVar60) * uVar59;
  auVar96._2_2_ = (ushort)((short)uVar68 < sVar61) * sVar61 | ((short)uVar68 >= sVar61) * uVar68;
  auVar96._4_2_ = (ushort)((short)uVar72 < sVar70) * sVar70 | ((short)uVar72 >= sVar70) * uVar72;
  auVar96._6_2_ = (ushort)((short)uVar76 < sVar69) * sVar69 | ((short)uVar76 >= sVar69) * uVar76;
  auVar96._8_2_ = (ushort)((short)uVar81 < sVar71) * sVar71 | ((short)uVar81 >= sVar71) * uVar81;
  auVar96._10_2_ = (ushort)((short)uVar82 < sVar74) * sVar74 | ((short)uVar82 >= sVar74) * uVar82;
  auVar96._12_2_ = (ushort)((short)uVar83 < sVar73) * sVar73 | ((short)uVar83 >= sVar73) * uVar83;
  auVar96._14_2_ = (ushort)((short)uVar84 < sVar75) * sVar75 | ((short)uVar84 >= sVar75) * uVar84;
  auVar62 = psraw(auVar96,3);
  auVar99._0_2_ = auVar62._0_2_ + 1;
  auVar99._2_2_ = auVar62._2_2_ + 1;
  auVar99._4_2_ = auVar62._4_2_ + 1;
  auVar99._6_2_ = auVar62._6_2_ + 1;
  auVar99._8_2_ = auVar62._0_2_ + 1;
  auVar99._10_2_ = auVar62._2_2_ + 1;
  auVar99._12_2_ = auVar62._4_2_ + 1;
  auVar99._14_2_ = auVar62._6_2_ + 1;
  auVar86 = psraw(auVar99,1);
  auVar52._8_8_ = lStack_1b0;
  auVar52._0_8_ = local_1b8;
  auVar45._8_8_ = SUB168(~(undefined1  [16])hev & auVar86,8);
  auVar45._0_8_ = auVar62._8_8_;
  auVar97._8_8_ = SUB168(~(undefined1  [16])hev & auVar86,0);
  auVar97._0_8_ = auVar62._0_8_;
  auVar39 = psubsw(auVar39,auVar97);
  auVar62 = paddsw(auVar45,auVar91);
  sVar35 = auVar39._0_2_;
  uVar59 = (ushort)(sVar78 < sVar35) * sVar78 | (ushort)(sVar78 >= sVar35) * sVar35;
  sVar35 = auVar39._2_2_;
  uVar68 = (ushort)(sVar77 < sVar35) * sVar77 | (ushort)(sVar77 >= sVar35) * sVar35;
  sVar35 = auVar39._4_2_;
  uVar72 = (ushort)(sVar79 < sVar35) * sVar79 | (ushort)(sVar79 >= sVar35) * sVar35;
  sVar35 = auVar39._6_2_;
  uVar76 = (ushort)(sVar80 < sVar35) * sVar80 | (ushort)(sVar80 >= sVar35) * sVar35;
  sVar35 = auVar39._8_2_;
  uVar81 = (ushort)(sVar85 < sVar35) * sVar85 | (ushort)(sVar85 >= sVar35) * sVar35;
  sVar35 = auVar39._10_2_;
  uVar82 = (ushort)(sVar88 < sVar35) * sVar88 | (ushort)(sVar88 >= sVar35) * sVar35;
  sVar35 = auVar39._12_2_;
  sVar43 = auVar39._14_2_;
  uVar83 = (ushort)(sVar89 < sVar35) * sVar89 | (ushort)(sVar89 >= sVar35) * sVar35;
  uVar84 = (ushort)(sVar90 < sVar43) * sVar90 | (ushort)(sVar90 >= sVar43) * sVar43;
  auVar40._0_2_ = (ushort)((short)uVar59 < sVar60) * sVar60 | ((short)uVar59 >= sVar60) * uVar59;
  auVar40._2_2_ = (ushort)((short)uVar68 < sVar61) * sVar61 | ((short)uVar68 >= sVar61) * uVar68;
  auVar40._4_2_ = (ushort)((short)uVar72 < sVar70) * sVar70 | ((short)uVar72 >= sVar70) * uVar72;
  auVar40._6_2_ = (ushort)((short)uVar76 < sVar69) * sVar69 | ((short)uVar76 >= sVar69) * uVar76;
  auVar40._8_2_ = (ushort)((short)uVar81 < sVar71) * sVar71 | ((short)uVar81 >= sVar71) * uVar81;
  auVar40._10_2_ = (ushort)((short)uVar82 < sVar74) * sVar74 | ((short)uVar82 >= sVar74) * uVar82;
  auVar40._12_2_ = (ushort)((short)uVar83 < sVar73) * sVar73 | ((short)uVar83 >= sVar73) * uVar83;
  auVar40._14_2_ = (ushort)((short)uVar84 < sVar75) * sVar75 | ((short)uVar84 >= sVar75) * uVar84;
  sVar35 = auVar62._0_2_;
  uVar59 = (ushort)(sVar78 < sVar35) * sVar78 | (ushort)(sVar78 >= sVar35) * sVar35;
  sVar78 = auVar62._2_2_;
  uVar68 = (ushort)(sVar77 < sVar78) * sVar77 | (ushort)(sVar77 >= sVar78) * sVar78;
  sVar78 = auVar62._4_2_;
  uVar72 = (ushort)(sVar79 < sVar78) * sVar79 | (ushort)(sVar79 >= sVar78) * sVar78;
  sVar78 = auVar62._6_2_;
  uVar76 = (ushort)(sVar80 < sVar78) * sVar80 | (ushort)(sVar80 >= sVar78) * sVar78;
  sVar78 = auVar62._8_2_;
  uVar81 = (ushort)(sVar85 < sVar78) * sVar85 | (ushort)(sVar85 >= sVar78) * sVar78;
  sVar78 = auVar62._10_2_;
  uVar82 = (ushort)(sVar88 < sVar78) * sVar88 | (ushort)(sVar88 >= sVar78) * sVar78;
  sVar78 = auVar62._12_2_;
  sVar77 = auVar62._14_2_;
  uVar83 = (ushort)(sVar89 < sVar78) * sVar89 | (ushort)(sVar89 >= sVar78) * sVar78;
  uVar84 = (ushort)(sVar90 < sVar77) * sVar90 | (ushort)(sVar90 >= sVar77) * sVar77;
  auVar46._0_2_ = (ushort)((short)uVar59 < sVar60) * sVar60 | ((short)uVar59 >= sVar60) * uVar59;
  auVar46._2_2_ = (ushort)((short)uVar68 < sVar61) * sVar61 | ((short)uVar68 >= sVar61) * uVar68;
  auVar46._4_2_ = (ushort)((short)uVar72 < sVar70) * sVar70 | ((short)uVar72 >= sVar70) * uVar72;
  auVar46._6_2_ = (ushort)((short)uVar76 < sVar69) * sVar69 | ((short)uVar76 >= sVar69) * uVar76;
  auVar46._8_2_ = (ushort)((short)uVar81 < sVar71) * sVar71 | ((short)uVar81 >= sVar71) * uVar81;
  auVar46._10_2_ = (ushort)((short)uVar82 < sVar74) * sVar74 | ((short)uVar82 >= sVar74) * uVar82;
  auVar46._12_2_ = (ushort)((short)uVar83 < sVar73) * sVar73 | ((short)uVar83 >= sVar73) * uVar83;
  auVar46._14_2_ = (ushort)((short)uVar84 < sVar75) * sVar75 | ((short)uVar84 >= sVar75) * uVar84;
  auVar86 = paddsw(auVar40,auVar38);
  auVar38 = paddsw(auVar46,auVar38);
  auVar62._8_8_ = lStack_190;
  auVar62._0_8_ = local_198;
  auVar39 = psubusw(auVar52,auVar62);
  auVar87 = psubusw(auVar62,auVar52);
  auVar87 = auVar87 | auVar39;
  auVar39._8_8_ = uStack_1a0;
  auVar39._0_8_ = local_1a8;
  auVar91 = psubusw(auVar39,auVar62);
  auVar39 = psubusw(auVar62,auVar39);
  auVar39 = auVar39 | auVar91;
  sVar60 = auVar87._0_2_;
  sVar61 = auVar39._0_2_;
  uVar59 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
  sVar60 = auVar87._2_2_;
  sVar61 = auVar39._2_2_;
  uVar68 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
  sVar60 = auVar87._4_2_;
  sVar61 = auVar39._4_2_;
  uVar72 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
  sVar60 = auVar87._6_2_;
  sVar61 = auVar39._6_2_;
  uVar76 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
  sVar60 = auVar87._8_2_;
  sVar61 = auVar39._8_2_;
  uVar81 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
  sVar60 = auVar87._10_2_;
  sVar61 = auVar39._10_2_;
  uVar82 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
  sVar60 = auVar87._12_2_;
  sVar61 = auVar39._12_2_;
  sVar70 = auVar39._14_2_;
  uVar83 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
  sVar60 = auVar87._14_2_;
  uVar84 = (ushort)(sVar70 < sVar60) * sVar60 | (ushort)(sVar70 >= sVar60) * sVar70;
  uVar59 = (ushort)((short)uVar59 < (short)abs_p1p0[0]) * (short)abs_p1p0[0] |
           ((short)uVar59 >= (short)abs_p1p0[0]) * uVar59;
  uVar68 = (ushort)((short)uVar68 < abs_p1p0[0]._2_2_) * abs_p1p0[0]._2_2_ |
           ((short)uVar68 >= abs_p1p0[0]._2_2_) * uVar68;
  uVar72 = (ushort)((short)uVar72 < abs_p1p0[0]._4_2_) * abs_p1p0[0]._4_2_ |
           ((short)uVar72 >= abs_p1p0[0]._4_2_) * uVar72;
  uVar76 = (ushort)((short)uVar76 < abs_p1p0[0]._6_2_) * abs_p1p0[0]._6_2_ |
           ((short)uVar76 >= abs_p1p0[0]._6_2_) * uVar76;
  uVar81 = (ushort)((short)uVar81 < (short)abs_p1p0[1]) * (short)abs_p1p0[1] |
           ((short)uVar81 >= (short)abs_p1p0[1]) * uVar81;
  uVar82 = (ushort)((short)uVar82 < abs_p1p0[1]._2_2_) * abs_p1p0[1]._2_2_ |
           ((short)uVar82 >= abs_p1p0[1]._2_2_) * uVar82;
  uVar83 = (ushort)((short)uVar83 < abs_p1p0[1]._4_2_) * abs_p1p0[1]._4_2_ |
           ((short)uVar83 >= abs_p1p0[1]._4_2_) * uVar83;
  uVar84 = (ushort)((short)uVar84 < abs_p1p0[1]._6_2_) * abs_p1p0[1]._6_2_ |
           ((short)uVar84 >= abs_p1p0[1]._6_2_) * uVar84;
  auVar39 = psllw(_DAT_0046e8b0,auVar48);
  auVar53._0_2_ =
       ((short)uVar81 < (short)uVar59) * uVar59 | ((short)uVar81 >= (short)uVar59) * uVar81;
  auVar53._2_2_ =
       ((short)uVar82 < (short)uVar68) * uVar68 | ((short)uVar82 >= (short)uVar68) * uVar82;
  auVar53._4_2_ =
       ((short)uVar83 < (short)uVar72) * uVar72 | ((short)uVar83 >= (short)uVar72) * uVar83;
  auVar53._6_2_ =
       ((short)uVar84 < (short)uVar76) * uVar76 | ((short)uVar84 >= (short)uVar76) * uVar84;
  auVar53._8_2_ = (0 < (short)uVar81) * uVar81;
  auVar53._10_2_ = (0 < (short)uVar82) * uVar82;
  auVar53._12_2_ = (0 < (short)uVar83) * uVar83;
  auVar53._14_2_ = (0 < (short)uVar84) * uVar84;
  auVar39 = psubusw(auVar53,auVar39);
  auVar54._0_2_ = -(ushort)(auVar39._0_2_ == 0);
  auVar54._2_2_ = -(ushort)(auVar39._2_2_ == 0);
  auVar54._4_2_ = -(ushort)(auVar39._4_2_ == 0);
  auVar54._6_2_ = -(ushort)(auVar39._6_2_ == 0);
  auVar54._8_2_ = -(ushort)(auVar39._8_2_ == 0);
  auVar54._10_2_ = -(ushort)(auVar39._10_2_ == 0);
  auVar54._12_2_ = -(ushort)(auVar39._12_2_ == 0);
  auVar54._14_2_ = -(ushort)(auVar39._14_2_ == 0);
  auVar54 = auVar54 & (undefined1  [16])mask;
  auVar55._0_8_ = auVar54._0_8_;
  auVar55._8_4_ = auVar54._0_4_;
  auVar55._12_4_ = auVar54._4_4_;
  auVar48._0_2_ = -(ushort)(auVar54._0_2_ == 0);
  auVar48._2_2_ = -(ushort)(auVar54._2_2_ == 0);
  auVar48._4_2_ = -(ushort)(auVar54._4_2_ == 0);
  auVar48._6_2_ = -(ushort)(auVar54._6_2_ == 0);
  auVar48._8_2_ = -(ushort)(auVar54._0_2_ == 0);
  auVar48._10_2_ = -(ushort)(auVar54._2_2_ == 0);
  auVar48._12_2_ = -(ushort)(auVar54._4_2_ == 0);
  auVar48._14_2_ = -(ushort)(auVar54._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar48._14_2_ >> 7) & 1) << 0xe | auVar48._14_2_ & 0x8000) == 0xffff
     ) {
    auVar50._8_8_ = lStack_180;
    auVar50._0_8_ = local_188;
    auVar21._8_8_ = lStack_250;
    auVar21._0_8_ = local_258;
    auVar51 = auVar21._0_12_;
  }
  else {
    sVar60 = (short)local_1c8 + (short)local_1f8 + (short)local_228 + (short)local_238 * 2 + 4;
    sVar69 = local_1c8._2_2_ + local_1f8._2_2_ + local_228._2_2_ + local_238._2_2_ * 2 + 4;
    sVar73 = local_1c8._4_2_ + local_1f8._4_2_ + local_228._4_2_ + local_238._4_2_ * 2 + 4;
    sVar77 = local_1c8._6_2_ + local_1f8._6_2_ + local_228._6_2_ + local_238._6_2_ * 2 + 4;
    sVar85 = (short)local_208 + (short)local_1d8;
    sVar88 = local_208._2_2_ + local_1d8._2_2_;
    sVar89 = local_208._4_2_ + local_1d8._4_2_;
    sVar90 = local_208._6_2_ + local_1d8._6_2_;
    sVar61 = (sVar60 - (short)local_238) + (short)local_1e8;
    sVar70 = (sVar69 - local_238._2_2_) + local_1e8._2_2_;
    sVar74 = (sVar73 - local_238._4_2_) + local_1e8._4_2_;
    sVar78 = (sVar77 - local_238._6_2_) + local_1e8._6_2_;
    auVar93._0_2_ = (ushort)((short)local_1c8 + sVar85 + sVar61) >> 3;
    auVar93._2_2_ = (ushort)(local_1c8._2_2_ + sVar88 + sVar70) >> 3;
    auVar93._4_2_ = (ushort)(local_1c8._4_2_ + sVar89 + sVar74) >> 3;
    auVar93._6_2_ = (ushort)(local_1c8._6_2_ + sVar90 + sVar78) >> 3;
    auVar93._8_2_ = (ushort)(sVar85 + (short)local_1f8 + sVar60) >> 3;
    auVar93._10_2_ = (ushort)(sVar88 + local_1f8._2_2_ + sVar69) >> 3;
    auVar93._12_2_ = (ushort)(sVar89 + local_1f8._4_2_ + sVar73) >> 3;
    auVar93._14_2_ = (ushort)(sVar90 + local_1f8._6_2_ + sVar77) >> 3;
    sVar61 = (sVar61 - (short)local_238) + (short)local_218;
    sVar71 = (sVar70 - local_238._2_2_) + local_218._2_2_;
    sVar75 = (sVar74 - local_238._4_2_) + local_218._4_2_;
    sVar79 = (sVar78 - local_238._6_2_) + local_218._6_2_;
    sVar70 = (sVar61 - (short)local_228) + (short)local_218;
    sVar74 = (sVar71 - local_228._2_2_) + local_218._2_2_;
    sVar78 = (sVar75 - local_228._4_2_) + local_218._4_2_;
    sVar80 = (sVar79 - local_228._6_2_) + local_218._6_2_;
    auVar98._0_2_ = (ushort)((short)local_1d8 + sVar85 + sVar61) >> 3;
    auVar98._2_2_ = (ushort)(local_1d8._2_2_ + sVar88 + sVar71) >> 3;
    auVar98._4_2_ = (ushort)(local_1d8._4_2_ + sVar89 + sVar75) >> 3;
    auVar98._6_2_ = (ushort)(local_1d8._6_2_ + sVar90 + sVar79) >> 3;
    auVar98._8_2_ = (ushort)((short)local_208 + sVar85 + sVar70) >> 3;
    auVar98._10_2_ = (ushort)(local_208._2_2_ + sVar88 + sVar74) >> 3;
    auVar98._12_2_ = (ushort)(local_208._4_2_ + sVar89 + sVar78) >> 3;
    auVar98._14_2_ = (ushort)(local_208._6_2_ + sVar90 + sVar80) >> 3;
    auVar87._0_2_ = sVar85 - (short)local_1f8;
    auVar87._2_2_ = sVar88 - local_1f8._2_2_;
    auVar87._4_2_ = sVar89 - local_1f8._4_2_;
    auVar87._6_2_ = sVar90 - local_1f8._6_2_;
    auVar87._8_2_ = ((short)uStack_200 + (short)uStack_1d0) - (short)uStack_1f0;
    auVar87._10_2_ = (uStack_200._2_2_ + uStack_1d0._2_2_) - uStack_1f0._2_2_;
    auVar87._12_2_ = (uStack_200._4_2_ + uStack_1d0._4_2_) - uStack_1f0._4_2_;
    auVar87._14_2_ = (uStack_200._6_2_ + uStack_1d0._6_2_) - uStack_1f0._6_2_;
    auVar49._0_2_ = (ushort)((short)local_228 + (short)local_1d8 + (short)local_238 + sVar60) >> 3;
    auVar49._2_2_ = (ushort)(local_228._2_2_ + local_1d8._2_2_ + local_238._2_2_ + sVar69) >> 3;
    auVar49._4_2_ = (ushort)(local_228._4_2_ + local_1d8._4_2_ + local_238._4_2_ + sVar73) >> 3;
    auVar49._6_2_ = (ushort)(local_228._6_2_ + local_1d8._6_2_ + local_238._6_2_ + sVar77) >> 3;
    auVar49._8_2_ = (ushort)((short)local_1e8 + (short)local_218 + auVar87._0_2_ + sVar70) >> 3;
    auVar49._10_2_ = (ushort)(local_1e8._2_2_ + local_218._2_2_ + auVar87._2_2_ + sVar74) >> 3;
    auVar49._12_2_ = (ushort)(local_1e8._4_2_ + local_218._4_2_ + auVar87._4_2_ + sVar78) >> 3;
    auVar49._14_2_ = (ushort)(local_1e8._6_2_ + local_218._6_2_ + auVar87._6_2_ + sVar80) >> 3;
    auVar86 = auVar98 & auVar55 | ~auVar55 & auVar86;
    auVar38 = auVar93 & auVar55 | ~auVar55 & auVar38;
    auVar50 = auVar49 & auVar55 | ~auVar55 & auVar52;
    auVar51._8_4_ = 0;
    auVar51._0_8_ = auVar50._8_8_;
  }
  auVar22._8_8_ = lStack_240;
  auVar22._0_8_ = local_248;
  auVar67._0_12_ = auVar22._0_12_;
  auVar67._12_2_ = (short)((ulong)local_248 >> 0x30);
  auVar67._14_2_ = auVar50._6_2_;
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._0_10_ = auVar22._0_10_;
  auVar66._10_2_ = auVar50._4_2_;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = (short)((ulong)local_248 >> 0x20);
  auVar65._0_8_ = local_248;
  auVar26._4_8_ = auVar65._8_8_;
  auVar26._2_2_ = auVar50._2_2_;
  auVar26._0_2_ = (short)((ulong)local_248 >> 0x10);
  auVar64._0_4_ = CONCAT22(auVar50._0_2_,(short)local_248);
  auVar64._4_12_ = auVar26;
  auVar47._0_4_ = auVar38._0_4_;
  auVar47._12_4_ = auVar38._12_4_;
  auVar47._4_4_ = auVar38._8_4_;
  auVar47._8_4_ = auVar38._4_4_;
  auVar39 = pshufhw(auVar50,auVar47,0x72);
  auVar52 = pshuflw(auVar47,auVar47,0x72);
  auVar41._0_4_ = auVar86._0_4_;
  auVar41._12_4_ = auVar86._12_4_;
  auVar41._4_4_ = auVar86._8_4_;
  auVar41._8_4_ = auVar86._4_4_;
  auVar62 = pshufhw(auVar87,auVar41,0xd8);
  auVar58._12_2_ = auVar51._6_2_;
  auVar58._0_12_ = auVar51;
  auVar58._14_2_ = d7[0]._6_2_;
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._0_10_ = auVar51._0_10_;
  auVar57._10_2_ = d7[0]._4_2_;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._0_8_ = auVar51._0_8_;
  auVar56._8_2_ = auVar51._4_2_;
  auVar27._4_8_ = auVar56._8_8_;
  auVar27._2_2_ = d7[0]._2_2_;
  auVar27._0_2_ = auVar51._2_2_;
  auVar38 = pshuflw(auVar41,auVar41,0xd8);
  auVar92._0_8_ = auVar64._0_8_;
  auVar92._8_4_ = auVar26._0_4_;
  auVar92._12_4_ = auVar52._4_4_;
  auVar42._0_8_ = auVar38._0_8_;
  auVar42._8_4_ = auVar38._4_4_;
  auVar42._12_4_ = auVar27._0_4_;
  *(ulong *)(s + -4) = CONCAT44(auVar52._0_4_,auVar64._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22((undefined2)d7[0],auVar51._0_2_),auVar38._0_4_);
  *(long *)(s + (long)p + -4) = auVar92._8_8_;
  *(long *)(s + (long)p + -4 + 4) = auVar42._8_8_;
  puVar1 = s + (long)(p * 2) + -4;
  *(int *)puVar1 = auVar65._8_4_;
  *(int *)(puVar1 + 2) = auVar39._8_4_;
  *(int *)(puVar1 + 4) = auVar62._8_4_;
  *(int *)(puVar1 + 6) = auVar56._8_4_;
  *(undefined4 *)(s + lVar34) = auVar66._12_4_;
  *(int *)(s + lVar34 + 2) = auVar39._12_4_;
  *(int *)(s + lVar34 + 4) = auVar62._12_4_;
  *(undefined4 *)(s + lVar34 + 6) = auVar57._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i p2, p1, p0, p3, q0;
  __m128i q1q0, p1p0;

  p3 = _mm_loadu_si128((__m128i *)((s - 4) + 0 * p));
  p2 = _mm_loadu_si128((__m128i *)((s - 4) + 1 * p));
  p1 = _mm_loadu_si128((__m128i *)((s - 4) + 2 * p));
  p0 = _mm_loadu_si128((__m128i *)((s - 4) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&p3, &p2, &p1, &p0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  // Loop filtering
  highbd_lpf_internal_8_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4, &q1q0,
                             &p1p0, blimit, limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose8x8_low_sse2(&d0, &d1, &p0, &p1p0, &q1q0, &q0, &d6, &d7, &d0,
                               &d1, &d2, &d3);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), d0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), d1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), d2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), d3);
}